

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_inspect(REF_CELL ref_cell)

{
  uint uVar1;
  int iVar2;
  
  printf("ref_cell = %p\n",ref_cell);
  printf(" size_per = %d\n",(ulong)(uint)ref_cell->size_per);
  printf(" node_per = %d\n",(ulong)(uint)ref_cell->node_per);
  printf(" n = %d\n",(ulong)(uint)ref_cell->n);
  printf(" max = %d\n",(ulong)(uint)ref_cell->max);
  printf(" blank = %d\n",(ulong)(uint)ref_cell->blank);
  for (uVar1 = 0; (int)uVar1 < ref_cell->max; uVar1 = uVar1 + 1) {
    if (ref_cell->c2n[(long)(int)uVar1 * (long)ref_cell->size_per] != -1) {
      iVar2 = 0;
      printf(" %d:",(ulong)uVar1);
      while( true ) {
        if (ref_cell->size_per <= iVar2) break;
        printf(" %d",(ulong)(uint)ref_cell->c2n[(int)(ref_cell->size_per * uVar1 + iVar2)]);
        iVar2 = iVar2 + 1;
      }
      putchar(10);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_inspect(REF_CELL ref_cell) {
  REF_INT cell, node;
  printf("ref_cell = %p\n", (void *)ref_cell);
  printf(" size_per = %d\n", ref_cell_size_per(ref_cell));
  printf(" node_per = %d\n", ref_cell_node_per(ref_cell));
  printf(" n = %d\n", ref_cell_n(ref_cell));
  printf(" max = %d\n", ref_cell_max(ref_cell));
  printf(" blank = %d\n", ref_cell->blank);
  for (cell = 0; cell < ref_cell_max(ref_cell); cell++) {
    if (ref_cell_valid(ref_cell, cell)) {
      printf(" %d:", cell);
      for (node = 0; node < ref_cell_size_per(ref_cell); node++)
        printf(" %d", ref_cell_c2n(ref_cell, node, cell));
      printf("\n");
    }
  }

  return REF_SUCCESS;
}